

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O2

xmlChar * xmlTextReaderConstEncoding(xmlTextReaderPtr reader)

{
  xmlChar *pxVar1;
  
  if (reader != (xmlTextReaderPtr)0x0) {
    if (reader->ctxt == (xmlParserCtxtPtr)0x0) {
      if (reader->doc == (xmlDocPtr)0x0) {
        pxVar1 = (xmlChar *)0x0;
      }
      else {
        pxVar1 = reader->doc->encoding;
      }
    }
    else {
      pxVar1 = xmlGetActualEncoding(reader->ctxt);
    }
    pxVar1 = constString(reader,pxVar1);
    return pxVar1;
  }
  return (xmlChar *)0x0;
}

Assistant:

const xmlChar *
xmlTextReaderConstEncoding(xmlTextReaderPtr reader) {
    const xmlChar *encoding = NULL;

    if (reader == NULL)
        return(NULL);

    if (reader->ctxt != NULL)
        encoding = xmlGetActualEncoding(reader->ctxt);
    else if (reader->doc != NULL)
        encoding = reader->doc->encoding;

    return(constString(reader, encoding));
}